

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O2

void CPU::WDC65816::ProcessorStorageConstructor::absolute_jsr
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementPC);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPC);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPCThrowaway);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationPerform);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CyclePush);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CyclePush);
  return;
}

Assistant:

static void absolute_jsr(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);			// New PCL.
		target(CycleFetchPC);					// New PCH.
		target(CycleFetchPCThrowaway);			// IO.
		target(OperationPerform);				// [JSR].
		target(CyclePush);						// PCH.
		target(CyclePush);						// PCL.
	}